

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_tt_GetGlyphShape(nk_tt_fontinfo *info,nk_allocator *alloc,int glyph_index,
                       nk_tt_vertex **pvertices)

{
  uchar uVar1;
  uchar uVar2;
  short sVar3;
  uchar *puVar4;
  bool bVar5;
  int cy;
  float fVar6;
  ushort uVar7;
  uint uVar8;
  int num_vertices;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  nk_tt_vertex *vertices;
  ushort *puVar12;
  nk_tt_vertex *pnVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  short sVar18;
  int was_off;
  nk_int cy_00;
  nk_int nVar19;
  nk_int cx;
  nk_int nVar20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  short sVar24;
  byte bVar25;
  int sx;
  int sy;
  ushort uVar26;
  int iVar27;
  int iVar28;
  ushort *puVar29;
  nk_handle *alloc_00;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float local_7c;
  nk_tt_vertex *comp_verts;
  uint local_54;
  ushort *local_50;
  nk_tt_vertex **local_48;
  nk_handle *local_40;
  ulong local_38;
  
  puVar4 = info->data;
  local_40 = &alloc->userdata;
  uVar8 = nk_tt__GetGlyfOffset(info,glyph_index);
  *pvertices = (nk_tt_vertex *)0x0;
  if ((int)uVar8 < 0) {
LAB_00142741:
    uVar14 = 0;
  }
  else {
    uVar11 = (ulong)uVar8;
    uVar7 = CONCAT11(puVar4[uVar11],puVar4[uVar11 + 1]);
    local_48 = pvertices;
    if ((short)uVar7 < 1) {
      if (uVar7 == 0xffff) {
        uVar14 = 0;
        uVar8 = 1;
        vertices = (nk_tt_vertex *)0x0;
        puVar12 = (ushort *)(puVar4 + uVar11 + 10);
        alloc_00 = local_40;
        do {
          uVar10 = uVar8;
          if (uVar8 == 0) break;
          comp_verts = (nk_tt_vertex *)0x0;
          bVar23 = *(byte *)((long)puVar12 + 1);
          if ((bVar23 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                          ,0x275a,
                          "int nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *, struct nk_allocator *, int, struct nk_tt_vertex **)"
                         );
          }
          if ((bVar23 & 1) == 0) {
            iVar27 = (int)(char)puVar12[2];
            iVar16 = (int)*(char *)((long)puVar12 + 5);
            lVar22 = 6;
          }
          else {
            iVar27 = (int)CONCAT11((char)puVar12[2],*(undefined1 *)((long)puVar12 + 5));
            iVar16 = (int)(short)(puVar12[3] << 8 | puVar12[3] >> 8);
            lVar22 = 8;
          }
          puVar29 = (ushort *)(lVar22 + (long)puVar12);
          local_38 = CONCAT44(local_38._4_4_,(float)iVar16);
          if ((bVar23 & 8) == 0) {
            if ((bVar23 & 0x40) == 0) {
              if ((char)bVar23 < '\0') {
                uVar7 = *puVar29;
                local_7c = (float)(int)(short)(puVar29[1] << 8 | puVar29[1] >> 8) * 6.1035156e-05;
                fVar32 = (float)(int)(short)(puVar29[2] << 8 | puVar29[2] >> 8) * 6.1035156e-05;
                fVar30 = (float)(int)(short)(puVar29[3] << 8 | puVar29[3] >> 8) * 6.1035156e-05;
                puVar29 = puVar29 + 4;
                fVar6 = (float)(int)(short)(uVar7 << 8 | uVar7 >> 8) * 6.1035156e-05;
              }
              else {
                fVar32 = 0.0;
                fVar30 = 1.0;
                local_7c = 0.0;
                fVar6 = 1.0;
              }
            }
            else {
              uVar7 = *puVar29;
              fVar30 = (float)(int)(short)(puVar29[1] << 8 | puVar29[1] >> 8) * 6.1035156e-05;
              puVar29 = puVar29 + 2;
              fVar32 = 0.0;
              local_7c = 0.0;
              fVar6 = (float)(int)(short)(uVar7 << 8 | uVar7 >> 8) * 6.1035156e-05;
            }
          }
          else {
            fVar30 = (float)(int)(short)(*puVar29 << 8 | *puVar29 >> 8) * 6.1035156e-05;
            puVar29 = puVar29 + 1;
            fVar32 = 0.0;
            local_7c = 0.0;
            fVar6 = fVar30;
          }
          uVar10 = nk_tt_GetGlyphShape(info,(nk_allocator *)alloc_00,
                                       (uint)(ushort)(puVar12[1] << 8 | puVar12[1] >> 8),&comp_verts
                                      );
          if ((int)uVar10 < 1) {
LAB_001426e2:
            bVar5 = true;
            uVar10 = uVar8;
            uVar8 = bVar23 & 0x20;
          }
          else {
            fVar31 = fVar6 * fVar6 + local_7c * local_7c;
            fVar17 = (float)(0x5f375a84 - ((uint)fVar31 >> 1));
            fVar31 = (fVar31 * -0.5 * fVar17 * fVar17 + 1.5) * fVar17 * fVar31;
            fVar33 = fVar32 * fVar32 + fVar30 * fVar30;
            fVar17 = (float)(0x5f375a84 - ((uint)fVar33 >> 1));
            fVar33 = (fVar33 * -0.5 * fVar17 * fVar17 + 1.5) * fVar17 * fVar33;
            lVar22 = 0;
            do {
              fVar17 = (float)(int)*(short *)((long)&comp_verts->x + lVar22);
              fVar34 = (float)(int)*(short *)((long)&comp_verts->y + lVar22);
              *(short *)((long)&comp_verts->x + lVar22) =
                   (short)(int)((fVar6 * fVar17 + fVar32 * fVar34 + (float)iVar27) * fVar31);
              *(short *)((long)&comp_verts->y + lVar22) =
                   (short)(int)((fVar17 * local_7c + fVar34 * fVar30 + (float)local_38) * fVar33);
              fVar17 = (float)(int)*(short *)((long)&comp_verts->cx + lVar22);
              fVar34 = (float)(int)*(short *)((long)&comp_verts->cy + lVar22);
              *(short *)((long)&comp_verts->cx + lVar22) =
                   (short)(int)((fVar6 * fVar17 + fVar32 * fVar34 + (float)iVar27) * fVar31);
              *(short *)((long)&comp_verts->cy + lVar22) =
                   (short)(int)((fVar17 * local_7c + fVar34 * fVar30 + (float)local_38) * fVar33);
              lVar22 = lVar22 + 10;
            } while ((ulong)uVar10 * 10 != lVar22);
            local_54 = uVar8;
            local_50 = puVar29;
            pnVar13 = (nk_tt_vertex *)
                      (*(code *)alloc_00[1])(*alloc_00,(void *)0x0,(ulong)(uVar10 + uVar14) * 10);
            if (pnVar13 != (nk_tt_vertex *)0x0) {
              if (0 < (int)uVar14) {
                nk_memcopy(pnVar13,vertices,(ulong)uVar14 * 10);
              }
              nk_memcopy(pnVar13 + uVar14,comp_verts,(ulong)uVar10 * 10);
              alloc_00 = local_40;
              if (vertices != (nk_tt_vertex *)0x0) {
                (*(code *)local_40[2])(*local_40,vertices);
              }
              (*(code *)alloc_00[2])(*alloc_00,comp_verts);
              vertices = pnVar13;
              puVar29 = local_50;
              uVar8 = local_54;
              uVar14 = uVar10 + uVar14;
              goto LAB_001426e2;
            }
            if (vertices != (nk_tt_vertex *)0x0) {
              (*(code *)alloc_00[2])(*alloc_00,vertices);
            }
            puVar29 = local_50;
            uVar10 = local_54;
            if (comp_verts != (nk_tt_vertex *)0x0) {
              (*(code *)alloc_00[2])(*alloc_00,comp_verts);
            }
            bVar5 = false;
            uVar8 = uVar10;
          }
          puVar12 = puVar29;
        } while (bVar5);
        if (uVar10 != 0) goto LAB_00142741;
      }
      else {
        if ((short)((ushort)puVar4[uVar11] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x2791,
                        "int nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *, struct nk_allocator *, int, struct nk_tt_vertex **)"
                       );
        }
        uVar14 = 0;
        vertices = (nk_tt_vertex *)0x0;
      }
    }
    else {
      uVar8 = (uint)uVar7 * 2;
      uVar21 = (ulong)uVar8;
      uVar1 = puVar4[uVar21 + uVar11 + 10];
      uVar2 = puVar4[uVar21 + uVar11 + 0xb];
      bVar23 = puVar4[uVar21 + uVar11 + 8];
      bVar25 = puVar4[uVar21 + uVar11 + 9];
      uVar14 = (uint)bVar23 * 0x100 + (uint)bVar25;
      local_38 = (ulong)uVar14;
      vertices = (nk_tt_vertex *)
                 (*(code *)local_40[1])
                           (*local_40,(void *)0x0,(ulong)((uVar14 + (uint)uVar7 * 2) * 10 + 10));
      uVar14 = 0;
      if (vertices != (nk_tt_vertex *)0x0) {
        local_50 = (ushort *)(puVar4 + uVar11 + 10);
        puVar12 = (ushort *)(puVar4 + (ulong)CONCAT11(uVar1,uVar2) + uVar21 + uVar11 + 0xc);
        uVar14 = (uint)CONCAT11(bVar23,bVar25);
        lVar22 = 0;
        bVar23 = 0;
        bVar25 = 0;
        do {
          if (bVar25 == 0) {
            bVar23 = (byte)*puVar12;
            if ((bVar23 & 8) == 0) {
              puVar12 = (ushort *)((long)puVar12 + 1);
            }
            else {
              bVar25 = *(byte *)((long)puVar12 + 1);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            bVar25 = bVar25 - 1;
          }
          (&vertices[uVar21].type)[lVar22] = bVar23;
          lVar22 = lVar22 + 10;
        } while ((ulong)(uVar14 * 2 + 2) * 5 != lVar22);
        lVar22 = 0;
        sVar24 = 0;
        do {
          bVar23 = (&vertices[uVar21].type)[lVar22];
          if ((bVar23 & 2) == 0) {
            if ((bVar23 & 0x10) == 0) {
              sVar24 = sVar24 + (*puVar12 << 8 | *puVar12 >> 8);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            uVar7 = *puVar12;
            puVar12 = (ushort *)((long)puVar12 + 1);
            uVar26 = -(ushort)(byte)uVar7;
            if ((bVar23 & 0x10) != 0) {
              uVar26 = (ushort)(byte)uVar7;
            }
            sVar24 = sVar24 + uVar26;
          }
          *(short *)((long)&vertices[uVar21].x + lVar22) = sVar24;
          lVar22 = lVar22 + 10;
        } while ((ulong)(uVar14 * 2 + 2) * 5 != lVar22);
        lVar22 = 0;
        sVar24 = 0;
        do {
          bVar23 = (&vertices[uVar21 & 0xffff].type)[lVar22];
          if ((bVar23 & 4) == 0) {
            if ((bVar23 & 0x20) == 0) {
              sVar24 = sVar24 + (*puVar12 << 8 | *puVar12 >> 8);
              puVar12 = puVar12 + 1;
            }
          }
          else {
            uVar7 = *puVar12;
            puVar12 = (ushort *)((long)puVar12 + 1);
            uVar26 = -(ushort)(byte)uVar7;
            if ((bVar23 & 0x20) != 0) {
              uVar26 = (ushort)(byte)uVar7;
            }
            sVar24 = sVar24 + uVar26;
          }
          *(short *)((long)&vertices[uVar21 & 0xffff].y + lVar22) = sVar24;
          lVar22 = lVar22 + 10;
        } while ((ulong)(uVar14 * 2 + 2) * 5 != lVar22);
        num_vertices = 0;
        iVar27 = 0;
        iVar15 = 0;
        iVar9 = 0;
        nVar19 = 0;
        nVar20 = 0;
        sy = 0;
        sx = 0;
        uVar14 = 0;
        was_off = 0;
        iVar16 = 0;
        cy = 0;
        do {
          lVar22 = (long)(int)(iVar27 + uVar8);
          bVar23 = vertices[lVar22].type;
          sVar24 = vertices[lVar22].x;
          sVar3 = vertices[lVar22].y;
          cx = (nk_int)sVar24;
          cy_00 = (nk_int)sVar3;
          if (iVar9 == iVar27) {
            if (iVar27 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,was_off,uVar14,sx,sy,nVar20,
                                                nVar19,iVar16,cy);
            }
            sx = cx;
            sy = cy_00;
            if ((bVar23 & 1) == 0) {
              nVar20 = cx;
              nVar19 = cy_00;
              if ((vertices[lVar22 + 1].type & 1) == 0) {
                sx = vertices[lVar22 + 1].x + cx >> 1;
                sy = vertices[lVar22 + 1].y + cy_00 >> 1;
              }
              else {
                iVar27 = iVar27 + 1;
                sx = (int)vertices[lVar22 + 1].x;
                sy = (int)vertices[lVar22 + 1].y;
              }
            }
            uVar14 = bVar23 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)sy;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar9 = (ushort)(*(ushort *)((long)local_50 + (long)iVar15 * 2) << 8 |
                            *(ushort *)((long)local_50 + (long)iVar15 * 2) >> 8) + 1;
            iVar15 = iVar15 + 1;
            was_off = 0;
            iVar28 = iVar27;
            num_vertices = num_vertices + 1;
            cx = iVar16;
            cy_00 = cy;
          }
          else {
            sVar18 = (short)cy;
            iVar28 = iVar27;
            if ((bVar23 & 1) == 0) {
              iVar27 = num_vertices;
              if (was_off != 0) {
                iVar27 = num_vertices + 1;
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(iVar16 + cx) >> 1);
                vertices[num_vertices].y = (short)((uint)(cy_00 + cy) >> 1);
                vertices[num_vertices].cx = (short)iVar16;
                vertices[num_vertices].cy = sVar18;
              }
              was_off = 1;
              num_vertices = iVar27;
            }
            else {
              pnVar13 = vertices + num_vertices;
              if (was_off == 0) {
                pnVar13->type = '\x02';
                pnVar13->x = sVar24;
                pnVar13->y = sVar3;
                pnVar13->cx = 0;
                sVar18 = 0;
              }
              else {
                pnVar13->type = '\x03';
                pnVar13->x = sVar24;
                pnVar13->y = sVar3;
                pnVar13->cx = (short)iVar16;
              }
              pnVar13->cy = sVar18;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx = iVar16;
              cy_00 = cy;
            }
          }
          iVar27 = iVar28 + 1;
          iVar16 = cx;
          cy = cy_00;
        } while (iVar28 < (int)(float)local_38);
        uVar14 = stbtt__close_shape(vertices,num_vertices,was_off,uVar14,sx,sy,nVar20,nVar19,cx,
                                    cy_00);
      }
      if (vertices == (nk_tt_vertex *)0x0) {
        return 0;
      }
    }
    *local_48 = vertices;
  }
  return uVar14;
}

Assistant:

NK_INTERN int
nk_tt_GetGlyphShape(const struct nk_tt_fontinfo *info, struct nk_allocator *alloc,
    int glyph_index, struct nk_tt_vertex **pvertices)
{
    nk_short numberOfContours;
    const nk_byte *endPtsOfContours;
    const nk_byte *data = info->data;
    struct nk_tt_vertex *vertices=0;
    int num_vertices=0;
    int g = nk_tt__GetGlyfOffset(info, glyph_index);
    *pvertices = 0;

    if (g < 0) return 0;
    numberOfContours = nk_ttSHORT(data + g);
    if (numberOfContours > 0) {
        nk_byte flags=0,flagcount;
        nk_int ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
        nk_int x,y,cx,cy,sx,sy, scx,scy;
        const nk_byte *points;
        endPtsOfContours = (data + g + 10);
        ins = nk_ttUSHORT(data + g + 10 + numberOfContours * 2);
        points = data + g + 10 + numberOfContours * 2 + 2 + ins;

        n = 1+nk_ttUSHORT(endPtsOfContours + numberOfContours*2-2);
        m = n + 2*numberOfContours;  /* a loose bound on how many vertices we might need */
        vertices = (struct nk_tt_vertex *)alloc->alloc(alloc->userdata, 0, (nk_size)m * sizeof(vertices[0]));
        if (vertices == 0)
            return 0;

        next_move = 0;
        flagcount=0;

        /* in first pass, we load uninterpreted data into the allocated array */
        /* above, shifted to the end of the array so we won't overwrite it when */
        /* we create our final data starting from the front */
        off = m - n; /* starting offset for uninterpreted data, regardless of how m ends up being calculated */

        /* first load flags */
        for (i=0; i < n; ++i) {
            if (flagcount == 0) {
                flags = *points++;
                if (flags & 8)
                    flagcount = *points++;
            } else --flagcount;
            vertices[off+i].type = flags;
        }

        /* now load x coordinates */
        x=0;
        for (i=0; i < n; ++i) {
            flags = vertices[off+i].type;
            if (flags & 2) {
                nk_short dx = *points++;
                x += (flags & 16) ? dx : -dx; /* ??? */
            } else {
                if (!(flags & 16)) {
                    x = x + (nk_short) (points[0]*256 + points[1]);
                    points += 2;
                }
            }
            vertices[off+i].x = (nk_short) x;
        }

        /* now load y coordinates */
        y=0;
        for (i=0; i < n; ++i) {
            flags = vertices[off+i].type;
            if (flags & 4) {
                nk_short dy = *points++;
                y += (flags & 32) ? dy : -dy; /* ??? */
            } else {
                if (!(flags & 32)) {
                    y = y + (nk_short) (points[0]*256 + points[1]);
                    points += 2;
                }
            }
            vertices[off+i].y = (nk_short) y;
        }

        /* now convert them to our format */
        num_vertices=0;
        sx = sy = cx = cy = scx = scy = 0;
        for (i=0; i < n; ++i)
        {
            flags = vertices[off+i].type;
            x     = (nk_short) vertices[off+i].x;
            y     = (nk_short) vertices[off+i].y;

            if (next_move == i) {
                if (i != 0)
                    num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

                /* now start the new one                */
                start_off = !(flags & 1);
                if (start_off) {
                    /* if we start off with an off-curve point, then when we need to find a point on the curve */
                    /* where we can start, and we need to save some state for when we wraparound. */
                    scx = x;
                    scy = y;
                    if (!(vertices[off+i+1].type & 1)) {
                        /* next point is also a curve point, so interpolate an on-point curve */
                        sx = (x + (nk_int) vertices[off+i+1].x) >> 1;
                        sy = (y + (nk_int) vertices[off+i+1].y) >> 1;
                    } else {
                        /* otherwise just use the next point as our start point */
                        sx = (nk_int) vertices[off+i+1].x;
                        sy = (nk_int) vertices[off+i+1].y;
                        ++i; /* we're using point i+1 as the starting point, so skip it */
                    }
                } else {
                    sx = x;
                    sy = y;
                }
                nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vmove,sx,sy,0,0);
                was_off = 0;
                next_move = 1 + nk_ttUSHORT(endPtsOfContours+j*2);
                ++j;
            } else {
                if (!(flags & 1))
                { /* if it's a curve */
                    if (was_off) /* two off-curve control points in a row means interpolate an on-curve midpoint */
                        nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
                    cx = x;
                    cy = y;
                    was_off = 1;
                } else {
                    if (was_off)
                        nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vcurve, x,y, cx, cy);
                    else nk_tt_setvertex(&vertices[num_vertices++], NK_TT_vline, x,y,0,0);
                    was_off = 0;
                }
            }
        }
        num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
    } else if (numberOfContours == -1) {
        /* Compound shapes. */
        int more = 1;
        const nk_byte *comp = data + g + 10;
        num_vertices = 0;
        vertices = 0;

        while (more)
        {
            nk_ushort flags, gidx;
            int comp_num_verts = 0, i;
            struct nk_tt_vertex *comp_verts = 0, *tmp = 0;
            float mtx[6] = {1,0,0,1,0,0}, m, n;

            flags = (nk_ushort)nk_ttSHORT(comp); comp+=2;
            gidx = (nk_ushort)nk_ttSHORT(comp); comp+=2;

            if (flags & 2) { /* XY values */
                if (flags & 1) { /* shorts */
                    mtx[4] = nk_ttSHORT(comp); comp+=2;
                    mtx[5] = nk_ttSHORT(comp); comp+=2;
                } else {
                    mtx[4] = nk_ttCHAR(comp); comp+=1;
                    mtx[5] = nk_ttCHAR(comp); comp+=1;
                }
            } else {
                /* @TODO handle matching point */
                NK_ASSERT(0);
            }
            if (flags & (1<<3)) { /* WE_HAVE_A_SCALE */
                mtx[0] = mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = mtx[2] = 0;
            } else if (flags & (1<<6)) { /* WE_HAVE_AN_X_AND_YSCALE */
                mtx[0] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = mtx[2] = 0;
                mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
            } else if (flags & (1<<7)) { /* WE_HAVE_A_TWO_BY_TWO */
                mtx[0] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[1] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[2] = nk_ttSHORT(comp)/16384.0f; comp+=2;
                mtx[3] = nk_ttSHORT(comp)/16384.0f; comp+=2;
            }

             /* Find transformation scales. */
            m = (float) NK_SQRT(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
            n = (float) NK_SQRT(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

             /* Get indexed glyph. */
            comp_num_verts = nk_tt_GetGlyphShape(info, alloc, gidx, &comp_verts);
            if (comp_num_verts > 0)
            {
                /* Transform vertices. */
                for (i = 0; i < comp_num_verts; ++i) {
                    struct nk_tt_vertex* v = &comp_verts[i];
                    short x,y;
                    x=v->x; y=v->y;
                    v->x = (short)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
                    v->y = (short)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
                    x=v->cx; y=v->cy;
                    v->cx = (short)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
                    v->cy = (short)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
                }
                /* Append vertices. */
                tmp = (struct nk_tt_vertex*)alloc->alloc(alloc->userdata, 0,
                    (nk_size)(num_vertices+comp_num_verts)*sizeof(struct nk_tt_vertex));
                if (!tmp) {
                    if (vertices) alloc->free(alloc->userdata, vertices);
                    if (comp_verts) alloc->free(alloc->userdata, comp_verts);
                    return 0;
                }
                if (num_vertices > 0) NK_MEMCPY(tmp, vertices, (nk_size)num_vertices*sizeof(struct nk_tt_vertex));
                NK_MEMCPY(tmp+num_vertices, comp_verts, (nk_size)comp_num_verts*sizeof(struct nk_tt_vertex));
                if (vertices) alloc->free(alloc->userdata,vertices);
                vertices = tmp;
                alloc->free(alloc->userdata,comp_verts);
                num_vertices += comp_num_verts;
            }
            /* More components ? */
            more = flags & (1<<5);
        }
    } else if (numberOfContours < 0) {
        /* @TODO other compound variations? */
        NK_ASSERT(0);
    } else {
        /* numberOfCounters == 0, do nothing */
    }
    *pvertices = vertices;
    return num_vertices;
}